

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O0

bool __thiscall r_exec::HLPOverlay::scan_variable(HLPOverlay *this,uint16_t index)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  short sVar5;
  ushort uVar6;
  undefined4 local_28;
  ushort local_22;
  Atom a;
  uint16_t index_1;
  uint16_t i;
  uint16_t guard_count;
  uint16_t guard_set_index;
  uint16_t index_local;
  HLPOverlay *this_local;
  
  sVar5 = r_code::Atom::asIndex();
  bVar2 = r_code::Atom::getAtomCount();
  for (_a = 1; _a <= bVar2; _a = _a + 1) {
    local_22 = sVar5 + _a;
    local_28 = *(undefined4 *)((this->super_Overlay).code + (ulong)local_22 * 4);
    cVar3 = r_code::Atom::getDescriptor();
    if ((cVar3 == -0x73) && (uVar6 = r_code::Atom::asIndex(), uVar6 == local_22)) {
      bVar4 = r_code::Atom::asAssignmentIndex();
      this_local._7_1_ = scan_location(this,(ushort)bVar4);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    r_code::Atom::~Atom((Atom *)&local_28);
    if (bVar1) goto LAB_0024d8fa;
  }
  this_local._7_1_ = 0;
LAB_0024d8fa:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HLPOverlay::scan_variable(uint16_t index)   // check if the variable can be bound.
{
    uint16_t guard_set_index = code[HLP_BWD_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) {
        uint16_t index = guard_set_index + i;
        Atom a = code[index];

        switch (a.getDescriptor()) {
        case Atom::ASSIGN_PTR:
            if (a.asIndex() == index) {
                return scan_location(a.asAssignmentIndex());
            }

            break;
        }
    }

    return false;
}